

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

bool __thiscall
ON_Annotation::Internal_GetBBox_Begin
          (ON_Annotation *this,ON_SHA1_Hash *hash,double *boxmin,double *boxmax,bool bGrow)

{
  bool bVar1;
  double dVar2;
  bool bVar3;
  ON_BoundingBox cached_bbox;
  ON_BoundingBox local_98;
  ON_BoundingBox local_60;
  
  dVar2 = ON_DBL_QNAN;
  local_98.m_max.y = ON_BoundingBox::NanBoundingBox.m_max.y;
  local_98.m_max.z = ON_BoundingBox::NanBoundingBox.m_max.z;
  local_98.m_min.z = ON_BoundingBox::NanBoundingBox.m_min.z;
  local_98.m_max.x = ON_BoundingBox::NanBoundingBox.m_max.x;
  local_98.m_min.x = ON_BoundingBox::NanBoundingBox.m_min.x;
  local_98.m_min.y = ON_BoundingBox::NanBoundingBox.m_min.y;
  if (boxmax == (double *)0x0 || boxmin == (double *)0x0) {
    if (boxmin != (double *)0x0) {
      boxmin[2] = ON_DBL_QNAN;
      boxmin[1] = dVar2;
      *boxmin = dVar2;
    }
    dVar2 = ON_DBL_QNAN;
    if (boxmax != (double *)0x0) {
      boxmax[2] = ON_DBL_QNAN;
      boxmax[1] = dVar2;
      *boxmax = dVar2;
    }
    return false;
  }
  if (bGrow) {
    ON_3dPoint::ON_3dPoint(&local_98.m_min,boxmin);
    ON_3dPoint::ON_3dPoint(&local_60.m_min,boxmax);
    local_98.m_max.z = local_60.m_min.z;
    local_98.m_max.x = local_60.m_min.x;
    local_98.m_max.y = local_60.m_min.y;
    bVar3 = ON_BoundingBox::IsNotEmpty(&local_98);
    bVar1 = true;
    if (bVar3) goto LAB_003b3832;
  }
  local_98.m_max.y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
  local_98.m_max.z = ON_BoundingBox::EmptyBoundingBox.m_max.z;
  local_98.m_min.z = ON_BoundingBox::EmptyBoundingBox.m_min.z;
  local_98.m_max.x = ON_BoundingBox::EmptyBoundingBox.m_max.x;
  local_98.m_min.x = ON_BoundingBox::EmptyBoundingBox.m_min.x;
  local_98.m_min.y = ON_BoundingBox::EmptyBoundingBox.m_min.y;
  bVar1 = false;
LAB_003b3832:
  ON_BoundingBox::ON_BoundingBox(&local_60);
  bVar3 = ON_BoundingBoxCache::GetBoundingBox(&this->m_bbox_cache,hash,&local_60);
  if (bVar3) {
    if (bVar1) {
      ON_BoundingBox::Union(&local_98,&local_60);
    }
    else {
      local_98.m_max.y = local_60.m_max.y;
      local_98.m_max.z = local_60.m_max.z;
      local_98.m_min.z = local_60.m_min.z;
      local_98.m_max.x = local_60.m_max.x;
      local_98.m_min.x = local_60.m_min.x;
      local_98.m_min.y = local_60.m_min.y;
    }
  }
  *boxmin = local_98.m_min.x;
  boxmin[1] = local_98.m_min.y;
  boxmin[2] = local_98.m_min.z;
  *boxmax = local_98.m_max.x;
  boxmax[1] = local_98.m_max.y;
  boxmax[2] = local_98.m_max.z;
  return bVar3;
}

Assistant:

bool ON_Annotation::Internal_GetBBox_Begin(
  const ON_SHA1_Hash& hash,
  double* boxmin,
  double* boxmax,
  bool bGrow
) const
{
  ON_BoundingBox bbox = ON_BoundingBox::NanBoundingBox;
  if (nullptr != boxmin && nullptr != boxmax)
  {
    if (bGrow)
    {
      bbox.m_min = ON_3dPoint(boxmin);
      bbox.m_max = ON_3dPoint(boxmax);
      bGrow = bbox.IsNotEmpty();
    }
    if (false == bGrow)
      bbox = ON_BoundingBox::EmptyBoundingBox;
    ON_BoundingBox cached_bbox;
    const bool rc = m_bbox_cache.GetBoundingBox(hash, cached_bbox);
    if (rc)
    {
      if (bGrow)
        bbox.Union(cached_bbox);
      else
        bbox = cached_bbox;
    }
    boxmin[0] = bbox.m_min.x;
    boxmin[1] = bbox.m_min.y;
    boxmin[2] = bbox.m_min.z;
    boxmax[0] = bbox.m_max.x;
    boxmax[1] = bbox.m_max.y;
    boxmax[2] = bbox.m_max.z;
    return rc;
  }

  if (nullptr != boxmin)
  {
    boxmin[0] = boxmin[1] = boxmin[2] = ON_DBL_QNAN;
  }
  if (nullptr != boxmax)
  {
    boxmax[0] = boxmax[1] = boxmax[2] = ON_DBL_QNAN;
  }

  return false;
}